

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_butcher.c
# Opt level: O3

ARKodeButcherTable ARKodeButcherTable_Copy(ARKodeButcherTable B)

{
  uint stages;
  realtype *prVar1;
  realtype **pprVar2;
  realtype *prVar3;
  realtype **pprVar4;
  realtype *prVar5;
  realtype *prVar6;
  realtype *prVar7;
  realtype *prVar8;
  realtype *prVar9;
  int iVar10;
  ARKodeButcherTable pAVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  
  if (B == (ARKodeButcherTable)0x0) {
    return (ARKodeButcherTable)0x0;
  }
  stages = B->stages;
  uVar12 = (ulong)stages;
  prVar1 = B->d;
  pAVar11 = ARKodeButcherTable_Alloc(stages,(uint)(prVar1 != (realtype *)0x0));
  if (pAVar11 == (ARKodeButcherTable)0x0) {
    pAVar11 = (ARKodeButcherTable)0x0;
  }
  else {
    pAVar11->stages = B->stages;
    iVar10 = B->p;
    pAVar11->q = B->q;
    pAVar11->p = iVar10;
    if (0 < (int)stages) {
      pprVar2 = B->A;
      prVar3 = B->c;
      pprVar4 = pAVar11->A;
      prVar5 = pAVar11->c;
      prVar6 = B->b;
      prVar7 = pAVar11->b;
      uVar13 = 0;
      do {
        prVar5[uVar13] = prVar3[uVar13];
        prVar7[uVar13] = prVar6[uVar13];
        prVar8 = pprVar2[uVar13];
        prVar9 = pprVar4[uVar13];
        uVar14 = 0;
        do {
          prVar9[uVar14] = prVar8[uVar14];
          uVar14 = uVar14 + 1;
        } while (uVar12 != uVar14);
        uVar13 = uVar13 + 1;
      } while (uVar13 != uVar12);
      if (prVar1 != (realtype *)0x0 && 0 < (int)stages) {
        prVar1 = B->d;
        prVar3 = pAVar11->d;
        uVar13 = 0;
        do {
          prVar3[uVar13] = prVar1[uVar13];
          uVar13 = uVar13 + 1;
        } while (uVar12 != uVar13);
      }
    }
  }
  return pAVar11;
}

Assistant:

ARKodeButcherTable ARKodeButcherTable_Copy(ARKodeButcherTable B)
{
  int i, j, s;
  ARKodeButcherTable Bcopy;
  booleantype embedded;

  /* Check for legal input */
  if (B == NULL) return(NULL);

  /* Get the number of stages */
  s = B->stages;

  /* Does the table have an embedding? */
  embedded = (B->d != NULL) ? SUNTRUE : SUNFALSE;

  /* Allocate Butcher table structure */
  Bcopy = ARKodeButcherTable_Alloc(s, embedded);
  if (Bcopy == NULL) return(NULL);

  /* set the relevant parameters */
  Bcopy->stages = B->stages;
  Bcopy->q = B->q;
  Bcopy->p = B->p;

  /* Copy Butcher table */
  for (i=0; i<s; i++) {
    Bcopy->c[i] = B->c[i];
    Bcopy->b[i] = B->b[i];
    for (j=0; j<s; j++) {
      Bcopy->A[i][j] = B->A[i][j];
    }
  }

  if (embedded)
    for (i=0; i<s; i++)
      Bcopy->d[i] = B->d[i];

  return(Bcopy);
}